

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substring.cpp
# Opt level: O3

bool duckdb::SubstringStartEnd
               (int64_t input_size,int64_t offset,int64_t length,int64_t *start,int64_t *end)

{
  long lVar1;
  long lVar2;
  int64_t iVar3;
  
  if (length == 0) {
    return false;
  }
  if (offset < 1) {
    if (offset < 0) {
      lVar1 = offset + input_size;
      if (offset + input_size < 1) {
        lVar1 = 0;
      }
      goto LAB_009ebf3e;
    }
    *start = 0;
    lVar1 = 0;
    if (length < 2) {
      return false;
    }
    length = length + -1;
  }
  else {
    lVar1 = offset + -1;
    if (input_size < offset + -1) {
      lVar1 = input_size;
    }
LAB_009ebf3e:
    *start = lVar1;
    if (length < 1) {
      *end = lVar1;
      iVar3 = 0;
      if (0 < length + *start) {
        iVar3 = length + *start;
      }
      *start = iVar3;
      lVar2 = *end;
      goto LAB_009ebf86;
    }
  }
  lVar2 = lVar1 + length;
  if (input_size < lVar1 + length) {
    lVar2 = input_size;
  }
  *end = lVar2;
  iVar3 = *start;
LAB_009ebf86:
  return iVar3 != lVar2;
}

Assistant:

bool SubstringStartEnd(int64_t input_size, int64_t offset, int64_t length, int64_t &start, int64_t &end) {
	if (length == 0) {
		return false;
	}
	if (offset > 0) {
		// positive offset: scan from start
		start = MinValue<int64_t>(input_size, offset - 1);
	} else if (offset < 0) {
		// negative offset: scan from end (i.e. start = end + offset)
		start = MaxValue<int64_t>(input_size + offset, 0);
	} else {
		// offset = 0: special case, we start 1 character BEHIND the first character
		start = 0;
		length--;
		if (length <= 0) {
			return false;
		}
	}
	if (length > 0) {
		// positive length: go forward (i.e. end = start + offset)
		end = MinValue<int64_t>(input_size, start + length);
	} else {
		// negative length: go backwards (i.e. end = start, start = start + length)
		end = start;
		start = MaxValue<int64_t>(0, start + length);
	}
	if (start == end) {
		return false;
	}
	D_ASSERT(start < end);
	return true;
}